

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

void __thiscall FSingleLumpFont::LoadFON2(FSingleLumpFont *this,int lump,BYTE *data)

{
  BYTE BVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  BYTE *pBVar5;
  int iVar6;
  ulong uVar7;
  CharData *pCVar8;
  void *pvVar9;
  FFontChar2 *this_00;
  SBYTE code;
  int local_54;
  int iStack_50;
  int destSize;
  BYTE *data_p;
  BYTE *palette;
  WORD *widths;
  int *widths2;
  uint local_28;
  int totalwidth;
  int i;
  int count;
  BYTE *data_local;
  int lump_local;
  FSingleLumpFont *this_local;
  
  this->FontType = FONT2;
  (this->super_FFont).FontHeight = (uint)data[4] + (uint)data[5] * 0x100;
  (this->super_FFont).FirstChar = (uint)data[6];
  (this->super_FFont).LastChar = (uint)data[7];
  (this->super_FFont).ActiveColors = data[10] + 1;
  (this->super_FFont).PatchRemap = (BYTE *)0x0;
  this->RescalePalette = data[9] == '\0';
  iVar6 = ((this->super_FFont).LastChar - (this->super_FFont).FirstChar) + 1;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)iVar6;
  uVar7 = SUB168(auVar3 * ZEXT816(0x10),0);
  if (SUB168(auVar3 * ZEXT816(0x10),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pCVar8 = (CharData *)operator_new__(uVar7);
  (this->super_FFont).Chars = pCVar8;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)iVar6;
  uVar7 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pvVar9 = operator_new__(uVar7);
  if ((data[0xb] & 1) == 0) {
    (this->super_FFont).GlobalKerning = 0;
    palette = data + 0xc;
  }
  else {
    (this->super_FFont).GlobalKerning = (int)*(short *)(data + 0xc);
    palette = data + 0xe;
  }
  widths2._4_4_ = 0;
  if (data[8] == '\0') {
    for (local_28 = 0; (int)local_28 < iVar6; local_28 = local_28 + 1) {
      *(uint *)((long)pvVar9 + (long)(int)local_28 * 4) =
           (uint)*(ushort *)(palette + (long)(int)local_28 * 2);
      widths2._4_4_ = *(int *)((long)pvVar9 + (long)(int)local_28 * 4) + widths2._4_4_;
    }
    data_p = palette + (long)(int)local_28 * 2;
  }
  else {
    uVar2 = *(ushort *)palette;
    for (local_28 = 0; (int)local_28 < iVar6; local_28 = local_28 + 1) {
      *(uint *)((long)pvVar9 + (long)(int)local_28 * 4) = (uint)uVar2;
    }
    widths2._4_4_ = iVar6 * (uint)uVar2;
    data_p = palette + 2;
  }
  if (((this->super_FFont).FirstChar < 0x21) && (0x1f < (this->super_FFont).LastChar)) {
    (this->super_FFont).SpaceWidth =
         *(int *)((long)pvVar9 + (long)(0x20 - (this->super_FFont).FirstChar) * 4);
  }
  else if (((this->super_FFont).FirstChar < 0x4f) && (0x4d < (this->super_FFont).LastChar)) {
    (this->super_FFont).SpaceWidth =
         (*(int *)((long)pvVar9 + (long)(0x4e - (this->super_FFont).FirstChar) * 4) + 1) / 2;
  }
  else {
    (this->super_FFont).SpaceWidth = (widths2._4_4_ << 1) / (iVar6 * 3);
  }
  memcpy(this->PaletteData,data_p,(long)((this->super_FFont).ActiveColors * 3));
  _iStack_50 = data_p + (this->super_FFont).ActiveColors * 3;
  for (local_28 = 0; (int)local_28 < iVar6; local_28 = local_28 + 1) {
    local_54 = *(int *)((long)pvVar9 + (long)(int)local_28 * 4) * (this->super_FFont).FontHeight;
    (this->super_FFont).Chars[(int)local_28].XMove =
         *(int *)((long)pvVar9 + (long)(int)local_28 * 4);
    if (local_54 < 1) {
      (this->super_FFont).Chars[(int)local_28].Pic = (FTexture *)0x0;
    }
    else {
      this_00 = (FFontChar2 *)operator_new(0x78);
      i = (int)data;
      FFontChar2::FFontChar2
                (this_00,lump,iStack_50 - i,*(int *)((long)pvVar9 + (long)(int)local_28 * 4),
                 (this->super_FFont).FontHeight,0,0);
      (this->super_FFont).Chars[(int)local_28].Pic = (FTexture *)this_00;
      do {
        BVar1 = *_iStack_50;
        if ((char)BVar1 < '\0') {
          pBVar5 = _iStack_50 + 1;
          if (BVar1 != 0x80) {
            local_54 = local_54 - (1 - (char)BVar1);
            pBVar5 = _iStack_50 + 2;
          }
        }
        else {
          local_54 = local_54 - ((char)BVar1 + 1);
          pBVar5 = _iStack_50 + 1 + ((char)BVar1 + 1);
        }
        _iStack_50 = pBVar5;
      } while (0 < local_54);
    }
    if (local_54 < 0) {
      local_28 = (this->super_FFont).FirstChar + local_28;
      I_FatalError("Overflow decompressing char %d (%c) of %s",(ulong)local_28,(ulong)local_28,
                   (this->super_FFont).Name);
    }
  }
  (*(this->super_FFont)._vptr_FFont[4])();
  if (pvVar9 != (void *)0x0) {
    operator_delete__(pvVar9);
  }
  return;
}

Assistant:

void FSingleLumpFont::LoadFON2 (int lump, const BYTE *data)
{
	int count, i, totalwidth;
	int *widths2;
	WORD *widths;
	const BYTE *palette;
	const BYTE *data_p;

	FontType = FONT2;
	FontHeight = data[4] + data[5]*256;
	FirstChar = data[6];
	LastChar = data[7];
	ActiveColors = data[10]+1;
	PatchRemap = NULL;
	RescalePalette = data[9] == 0;
	
	count = LastChar - FirstChar + 1;
	Chars = new CharData[count];
	widths2 = new int[count];
	if (data[11] & 1)
	{ // Font specifies a kerning value.
		GlobalKerning = LittleShort(*(SWORD *)&data[12]);
		widths = (WORD *)(data + 14);
	}
	else
	{ // Font does not specify a kerning value.
		GlobalKerning = 0;
		widths = (WORD *)(data + 12);
	}
	totalwidth = 0;

	if (data[8])
	{ // Font is mono-spaced.
		totalwidth = LittleShort(widths[0]);
		for (i = 0; i < count; ++i)
		{
			widths2[i] = totalwidth;
		}
		totalwidth *= count;
		palette = (BYTE *)&widths[1];
	}
	else
	{ // Font has varying character widths.
		for (i = 0; i < count; ++i)
		{
			widths2[i] = LittleShort(widths[i]);
			totalwidth += widths2[i];
		}
		palette = (BYTE *)(widths + i);
	}

	if (FirstChar <= ' ' && LastChar >= ' ')
	{
		SpaceWidth = widths2[' '-FirstChar];
	}
	else if (FirstChar <= 'N' && LastChar >= 'N')
	{
		SpaceWidth = (widths2['N' - FirstChar] + 1) / 2;
	}
	else
	{
		SpaceWidth = totalwidth * 2 / (3 * count);
	}

	memcpy(PaletteData, palette, ActiveColors*3);

	data_p = palette + ActiveColors*3;

	for (i = 0; i < count; ++i)
	{
		int destSize = widths2[i] * FontHeight;
		Chars[i].XMove = widths2[i];
		if (destSize <= 0)
		{
			Chars[i].Pic = NULL;
		}
		else
		{
			Chars[i].Pic = new FFontChar2 (lump, int(data_p - data), widths2[i], FontHeight);
			do
			{
				SBYTE code = *data_p++;
				if (code >= 0)
				{
					data_p += code+1;
					destSize -= code+1;
				}
				else if (code != -128)
				{
					data_p++;
					destSize -= (-code)+1;
				}
			} while (destSize > 0);
		}
		if (destSize < 0)
		{
			i += FirstChar;
			I_FatalError ("Overflow decompressing char %d (%c) of %s", i, i, Name);
		}
	}

	LoadTranslations();
	delete[] widths2;
}